

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O0

int cmime_message_add_child_part
              (CMimeMessage_T *message,CMimePart_T *part,CMimePart_T *child,
              CMimeMultipartType_T subtype)

{
  char *__ptr;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *local_60;
  char *s;
  char *nl;
  char *content_type;
  char *boundary;
  CMimePart_T *current_part;
  CMimeListElem_T *elem;
  CMimePart_T *pCStack_28;
  CMimeMultipartType_T subtype_local;
  CMimePart_T *child_local;
  CMimePart_T *part_local;
  CMimeMessage_T *message_local;
  
  current_part = (CMimePart_T *)0x0;
  boundary = (char *)0x0;
  content_type = (char *)0x0;
  nl = (char *)0x0;
  s = (char *)0x0;
  local_60 = (char *)0x0;
  elem._4_4_ = subtype;
  pCStack_28 = child;
  child_local = part;
  part_local = (CMimePart_T *)message;
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x4e4,
                  "int cmime_message_add_child_part(CMimeMessage_T *, CMimePart_T *, CMimePart_T *, CMimeMultipartType_T)"
                 );
  }
  if (part == (CMimePart_T *)0x0) {
    __assert_fail("part",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x4e5,
                  "int cmime_message_add_child_part(CMimeMessage_T *, CMimePart_T *, CMimePart_T *, CMimeMultipartType_T)"
                 );
  }
  if (child == (CMimePart_T *)0x0) {
    __assert_fail("child",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x4e6,
                  "int cmime_message_add_child_part(CMimeMessage_T *, CMimePart_T *, CMimePart_T *, CMimeMultipartType_T)"
                 );
  }
  current_part = (CMimePart_T *)message->parts->head;
  while( true ) {
    if (current_part == (CMimePart_T *)0x0) {
      return -1;
    }
    boundary = (char *)current_part->headers;
    if (((CMimePart_T *)boundary == part) && (part->boundary == (char *)0x0)) break;
    current_part = (CMimePart_T *)current_part->boundary;
  }
  if (message->linebreak == (char *)0x0) {
    s = "\r\n";
  }
  else {
    s = message->linebreak;
  }
  switch(subtype) {
  case CMIME_MULTIPART_MIXED:
    asprintf(&nl,"multipart/mixed;%s\t",s);
    break;
  case CMIME_MULTIPART_DIGEST:
    asprintf(&nl,"multipart/digest;%s\t",s);
    break;
  case CMIME_MULTIPART_MESSAGE:
    asprintf(&nl,"message/rfc822;%s\t",s);
    break;
  case CMIME_MULTIPART_ALTERNATIVE:
    asprintf(&nl,"multipart/alternative;%s\t",s);
    break;
  default:
    asprintf(&nl,"multipart/mixed;%s\t",s);
  }
  content_type = cmime_message_generate_boundary();
  asprintf(&local_60,"boundary=\"%s\"",content_type);
  child_local->boundary = content_type;
  pcVar2 = strdup(content_type);
  __ptr = nl;
  pCStack_28->parent_boundary = pcVar2;
  sVar3 = strlen(nl);
  sVar4 = strlen(local_60);
  nl = (char *)realloc(__ptr,sVar3 + sVar4 + 1);
  strcat(nl,local_60);
  free(local_60);
  if (child_local->last == 1) {
    child_local->last = 0;
    pCStack_28->last = 1;
  }
  cmime_part_set_content_type(child_local,nl);
  free(nl);
  iVar1 = cmime_list_insert_next
                    (*(CMimeList_T **)&part_local->last,(CMimeListElem_T *)current_part,pCStack_28);
  if (iVar1 != 0) {
    return -1;
  }
  return 0;
}

Assistant:

int cmime_message_add_child_part(CMimeMessage_T *message, CMimePart_T *part, CMimePart_T *child, CMimeMultipartType_T subtype) {
    CMimeListElem_T *elem = NULL;
    CMimePart_T *current_part = NULL;
    char *boundary = NULL;
    char *content_type = NULL;
    char *nl = NULL;
    char *s = NULL;

    assert(message);
    assert(part);
    assert(child);

    elem = cmime_list_head(message->parts);
    while(elem != NULL) {
        current_part = cmime_list_data(elem);
        if (current_part == part) {
            /* add a boundary, if not present */
            if (part->boundary == NULL) {
                if (message->linebreak)
                    nl = message->linebreak;
                else
                    nl = CRLF;

                switch(subtype) {
                    case CMIME_MULTIPART_MIXED:
                        asprintf(&content_type,"multipart/mixed;%s\t",nl);
                        break;
                    case CMIME_MULTIPART_DIGEST:
                        asprintf(&content_type,"multipart/digest;%s\t",nl);
                        break;
                    case CMIME_MULTIPART_ALTERNATIVE:
                        asprintf(&content_type,"multipart/alternative;%s\t",nl);
                        break;
                    case CMIME_MULTIPART_MESSAGE:
                        asprintf(&content_type,"message/rfc822;%s\t",nl);
                        break;
                    default:
                        asprintf(&content_type,"multipart/mixed;%s\t",nl);
                        break;
                }

                boundary = cmime_message_generate_boundary();
                asprintf(&s,"boundary=\"%s\"",boundary);
                part->boundary = boundary;
                child->parent_boundary = strdup(boundary);

                content_type = (char *)realloc(content_type,strlen(content_type) + strlen(s) + sizeof(char));
                strcat(content_type,s);
                free(s);
                if (part->last == 1) {
                    part->last = 0;
                    child->last = 1;
                }

                cmime_part_set_content_type(part, content_type);
                free(content_type);
                if (cmime_list_insert_next(message->parts,elem,child)!=0)
                    return(-1);
                
                return(0);
            }
        }
        elem = elem->next;
    }

    return(-1);
}